

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

Attribute * attrsLookup(TidyDocImpl *doc,TidyAttribImpl *attribs,ctmbstr atnam)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  AttrHash *pAVar4;
  char *pcVar5;
  char cVar6;
  Attribute *pAVar7;
  
  if (atnam != (ctmbstr)0x0) {
    cVar6 = *atnam;
    uVar3 = 0;
    if (cVar6 != '\0') {
      pcVar5 = atnam + 1;
      do {
        uVar1 = (int)uVar3 * 0x1f + (int)cVar6;
        uVar3 = (ulong)uVar1;
        cVar6 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar6 != '\0');
      uVar3 = (ulong)(uVar1 % 0xb2);
    }
    for (pAVar4 = attribs->hashtab[uVar3];
        (pAVar4 != (AttrHash *)0x0 && (pAVar4->attr != (Attribute *)0x0)); pAVar4 = pAVar4->next) {
      iVar2 = prvTidytmbstrcmp(atnam,pAVar4->attr->name);
      if (iVar2 == 0) {
        return pAVar4->attr;
      }
    }
    pAVar7 = attribute_defs;
    pcVar5 = "unknown!";
    do {
      iVar2 = prvTidytmbstrcmp(atnam,pcVar5);
      if (iVar2 == 0) {
        pAVar4 = (AttrHash *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x10);
        pAVar4->attr = pAVar7;
        cVar6 = *pcVar5;
        uVar3 = 0;
        if (cVar6 != '\0') {
          do {
            pcVar5 = pcVar5 + 1;
            uVar1 = (int)uVar3 * 0x1f + (int)cVar6;
            uVar3 = (ulong)uVar1;
            cVar6 = *pcVar5;
          } while (cVar6 != '\0');
          uVar3 = (ulong)(uVar1 % 0xb2);
        }
        pAVar4->next = attribs->hashtab[uVar3];
        attribs->hashtab[uVar3] = pAVar4;
        return pAVar7;
      }
      pcVar5 = pAVar7[1].name;
      pAVar7 = pAVar7 + 1;
    } while (pcVar5 != (tmbstr)0x0);
  }
  return (Attribute *)0x0;
}

Assistant:

static const Attribute* attrsLookup(TidyDocImpl* doc,
                               TidyAttribImpl* ARG_UNUSED(attribs),
                               ctmbstr atnam)
{
    const Attribute *np;
#if ATTRIBUTE_HASH_LOOKUP
    const AttrHash *p;
#endif

    if (!atnam)
        return NULL;

#if ATTRIBUTE_HASH_LOOKUP
    for (p = attribs->hashtab[attrsHash(atnam)]; p && p->attr; p = p->next)
        if (TY_(tmbstrcmp)(atnam, p->attr->name) == 0)
            return p->attr;

    for (np = attribute_defs; np && np->name; ++np)
        if (TY_(tmbstrcmp)(atnam, np->name) == 0)
            return attrsInstall(doc, attribs, np);
#else
    for (np = attribute_defs; np && np->name; ++np)
        if (TY_(tmbstrcmp)(atnam, np->name) == 0)
            return np;
#endif

    return NULL;
}